

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_CreateSubscription
               (UA_Server *server,UA_Session *session,UA_CreateSubscriptionRequest *request,
               UA_CreateSubscriptionResponse *response)

{
  UA_UInt32 UVar1;
  UA_Subscription *newSubscription_00;
  uint local_90;
  uint local_88;
  uint local_84;
  uint local_70;
  uint local_68;
  uint local_64;
  UA_Subscription *newSubscription;
  UA_CreateSubscriptionResponse *response_local;
  UA_CreateSubscriptionRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  newSubscription_00 = UA_Subscription_new(session,response->subscriptionId);
  if (newSubscription_00 == (UA_Subscription *)0x0) {
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_68 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_64 = 0;
      }
      else {
        local_64 = session->channel->connection->sockfd;
      }
      local_68 = local_64;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = (session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing CreateSubscriptionRequest failed"
                 ,(ulong)local_68,(ulong)local_70,(ulong)(session->sessionId).identifier.numeric,
                 (uint)(session->sessionId).identifier.guid.data2,
                 (uint)(session->sessionId).identifier.guid.data3,
                 (uint)(session->sessionId).identifier.guid.data4[0],
                 (uint)(session->sessionId).identifier.guid.data4[1],
                 (uint)(session->sessionId).identifier.guid.data4[2],
                 (uint)(session->sessionId).identifier.guid.data4[3],
                 (uint)(session->sessionId).identifier.guid.data4[4],
                 (uint)(session->sessionId).identifier.guid.data4[5],
                 (uint)(session->sessionId).identifier.guid.data4[6],
                 (uint)(session->sessionId).identifier.guid.data4[7]);
    (response->responseHeader).serviceResult = 0x80030000;
  }
  else {
    UVar1 = UA_Session_getUniqueSubscriptionID(session);
    newSubscription_00->subscriptionID = UVar1;
    UA_Session_addSubscription(session,newSubscription_00);
    newSubscription_00->publishingEnabled = (UA_Boolean)(request->publishingEnabled & 1);
    setSubscriptionSettings
              (server,newSubscription_00,request->requestedPublishingInterval,
               request->requestedLifetimeCount,request->requestedMaxKeepAliveCount,
               request->maxNotificationsPerPublish,request->priority);
    newSubscription_00->currentKeepAliveCount = newSubscription_00->maxKeepAliveCount;
    response->subscriptionId = newSubscription_00->subscriptionID;
    response->revisedPublishingInterval = newSubscription_00->publishingInterval;
    response->revisedLifetimeCount = newSubscription_00->lifeTimeCount;
    response->revisedMaxKeepAliveCount = newSubscription_00->maxKeepAliveCount;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_88 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = session->channel->connection->sockfd;
      }
      local_88 = local_84;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_90 = 0;
    }
    else {
      local_90 = (session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | CreateSubscriptionRequest: Created Subscription %u with a publishing interval of %f ms"
                 ,newSubscription_00->publishingInterval,(ulong)local_88,(ulong)local_90,
                 (ulong)(session->sessionId).identifier.numeric,
                 (uint)(session->sessionId).identifier.guid.data2,
                 (uint)(session->sessionId).identifier.guid.data3,
                 (uint)(session->sessionId).identifier.guid.data4[0],
                 (uint)(session->sessionId).identifier.guid.data4[1],
                 (uint)(session->sessionId).identifier.guid.data4[2],
                 (uint)(session->sessionId).identifier.guid.data4[3],
                 (uint)(session->sessionId).identifier.guid.data4[4],
                 (uint)(session->sessionId).identifier.guid.data4[5],
                 (uint)(session->sessionId).identifier.guid.data4[6],
                 (uint)(session->sessionId).identifier.guid.data4[7],response->subscriptionId);
  }
  return;
}

Assistant:

void
Service_CreateSubscription(UA_Server *server, UA_Session *session,
                           const UA_CreateSubscriptionRequest *request,
                           UA_CreateSubscriptionResponse *response) {
    /* Create the subscription */
    UA_Subscription *newSubscription = UA_Subscription_new(session, response->subscriptionId);
    if(!newSubscription) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session,
                             "Processing CreateSubscriptionRequest failed");
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    newSubscription->subscriptionID = UA_Session_getUniqueSubscriptionID(session);
    UA_Session_addSubscription(session, newSubscription);

    /* Set the subscription parameters */
    newSubscription->publishingEnabled = request->publishingEnabled;
    setSubscriptionSettings(server, newSubscription, request->requestedPublishingInterval,
                            request->requestedLifetimeCount, request->requestedMaxKeepAliveCount,
                            request->maxNotificationsPerPublish, request->priority);
    newSubscription->currentKeepAliveCount = newSubscription->maxKeepAliveCount; /* set settings first */

    /* Prepare the response */
    response->subscriptionId = newSubscription->subscriptionID;
    response->revisedPublishingInterval = newSubscription->publishingInterval;
    response->revisedLifetimeCount = newSubscription->lifeTimeCount;
    response->revisedMaxKeepAliveCount = newSubscription->maxKeepAliveCount;

    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "CreateSubscriptionRequest: Created Subscription %u "
                         "with a publishing interval of %f ms", response->subscriptionId,
                         newSubscription->publishingInterval);
}